

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NonAnsiUdpPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NonAnsiUdpPortListSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_1,Token *args_2,
          Token *args_3)

{
  Token openParen;
  Token closeParen;
  Token semi;
  NonAnsiUdpPortListSyntax *this_00;
  
  this_00 = (NonAnsiUdpPortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NonAnsiUdpPortListSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (NonAnsiUdpPortListSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  closeParen.kind = args_2->kind;
  closeParen._2_1_ = args_2->field_0x2;
  closeParen.numFlags.raw = (args_2->numFlags).raw;
  closeParen.rawLen = args_2->rawLen;
  closeParen.info = args_2->info;
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  slang::syntax::NonAnsiUdpPortListSyntax::NonAnsiUdpPortListSyntax
            (this_00,openParen,args_1,closeParen,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }